

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLogLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_int>,_ImPlot::GetterXsYs<unsigned_int>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  int iVar2;
  GetterXsYs<unsigned_int> *pGVar3;
  TransformerLogLin *pTVar4;
  ImPlotPlot *pIVar5;
  ImDrawVert *pIVar6;
  ImDrawIdx *pIVar7;
  undefined1 auVar8 [12];
  double dVar9;
  ImPlotContext *pIVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  long lVar13;
  ushort uVar14;
  ImDrawIdx IVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  double dVar21;
  ImVec2 IVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar37 [16];
  
  pIVar10 = GImPlot;
  pGVar3 = this->Getter1;
  pTVar4 = this->Transformer;
  iVar12 = pGVar3->Count;
  lVar13 = (long)(((pGVar3->Offset + prim + 1) % iVar12 + iVar12) % iVar12) * (long)pGVar3->Stride;
  uVar16 = *(uint *)((long)pGVar3->Ys + lVar13);
  dVar21 = log10((double)*(uint *)((long)pGVar3->Xs + lVar13) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar11 = GImPlot;
  pIVar5 = pIVar10->CurrentPlot;
  dVar9 = (pIVar5->XAxis).Range.Min;
  iVar12 = pTVar4->YAxis;
  pGVar3 = this->Getter2;
  pTVar4 = this->Transformer;
  iVar2 = pGVar3->Count;
  lVar13 = (long)(((prim + 1 + pGVar3->Offset) % iVar2 + iVar2) % iVar2) * (long)pGVar3->Stride;
  uVar17 = *(uint *)((long)pGVar3->Ys + lVar13);
  IVar1 = pIVar10->PixelRange[iVar12].Min;
  fVar23 = (float)(pIVar10->Mx *
                   (((double)(float)(dVar21 / pIVar10->LogDenX) *
                     ((pIVar5->XAxis).Range.Max - dVar9) + dVar9) - dVar9) + (double)IVar1.x);
  fVar25 = (float)(pIVar10->My[iVar12] * ((double)uVar16 - pIVar5->YAxis[iVar12].Range.Min) +
                  (double)IVar1.y);
  dVar21 = log10((double)*(uint *)((long)pGVar3->Xs + lVar13) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar5 = pIVar11->CurrentPlot;
  dVar9 = (pIVar5->XAxis).Range.Min;
  iVar12 = pTVar4->YAxis;
  IVar1 = pIVar11->PixelRange[iVar12].Min;
  IVar22.x = (float)(pIVar11->Mx *
                     (((double)(float)(dVar21 / pIVar11->LogDenX) *
                       ((pIVar5->XAxis).Range.Max - dVar9) + dVar9) - dVar9) + (double)IVar1.x);
  IVar22.y = (float)(pIVar11->My[iVar12] * ((double)uVar17 - pIVar5->YAxis[iVar12].Range.Min) +
                    (double)IVar1.y);
  fVar24 = (this->P12).x;
  fVar26 = (this->P12).y;
  fVar28 = (this->P11).x;
  fVar29 = (this->P11).y;
  uVar19 = -(uint)(fVar29 < fVar26);
  fVar27 = (float)(~-(uint)(fVar24 <= fVar28) & (uint)fVar24 |
                  (uint)fVar28 & -(uint)(fVar24 <= fVar28));
  fVar30 = (float)(~-(uint)(fVar26 <= fVar29) & (uint)fVar26 |
                  (uint)fVar29 & -(uint)(fVar26 <= fVar29));
  fVar33 = (float)(~-(uint)(fVar28 < fVar24) & (uint)fVar24 |
                  (uint)fVar28 & -(uint)(fVar28 < fVar24));
  fVar41 = (float)(~uVar19 & (uint)fVar26 | (uint)fVar29 & uVar19);
  uVar16 = -(uint)(fVar23 <= fVar27);
  uVar17 = -(uint)(fVar25 <= fVar30);
  uVar18 = -(uint)(fVar33 < fVar23);
  uVar20 = -(uint)(fVar41 < fVar25);
  fVar27 = (float)(~uVar16 & (uint)fVar23 | (uint)fVar27 & uVar16);
  fVar30 = (float)(~uVar17 & (uint)fVar25 | (uint)fVar30 & uVar17);
  fVar33 = (float)(~uVar18 & (uint)fVar23 | (uint)fVar33 & uVar18);
  fVar41 = (float)(~uVar20 & (uint)fVar25 | (uint)fVar41 & uVar20);
  uVar16 = -(uint)(IVar22.x <= fVar27);
  uVar17 = -(uint)(IVar22.y <= fVar30);
  uVar18 = -(uint)(fVar33 < IVar22.x);
  uVar20 = -(uint)(fVar41 < IVar22.y);
  auVar32._0_4_ = (uint)fVar27 & uVar16;
  auVar32._4_4_ = (uint)fVar30 & uVar17;
  auVar32._8_4_ = (uint)fVar33 & uVar18;
  auVar32._12_4_ = (uint)fVar41 & uVar20;
  auVar38._0_4_ = ~uVar16 & (uint)IVar22.x;
  auVar38._4_4_ = ~uVar17 & (uint)IVar22.y;
  auVar38._8_4_ = ~uVar18 & (uint)IVar22.x;
  auVar38._12_4_ = ~uVar20 & (uint)IVar22.y;
  auVar38 = auVar38 | auVar32;
  fVar27 = (cull_rect->Min).y;
  auVar40._4_4_ = -(uint)(fVar27 < auVar38._4_4_);
  auVar40._0_4_ = -(uint)((cull_rect->Min).x < auVar38._0_4_);
  auVar8._4_8_ = auVar38._8_8_;
  auVar8._0_4_ = -(uint)(auVar38._4_4_ < fVar27);
  auVar39._0_8_ = auVar8._0_8_ << 0x20;
  auVar39._8_4_ = -(uint)(auVar38._8_4_ < (cull_rect->Max).x);
  auVar39._12_4_ = -(uint)(auVar38._12_4_ < (cull_rect->Max).y);
  auVar40._8_8_ = auVar39._8_8_;
  iVar12 = movmskps((int)cull_rect,auVar40);
  if (iVar12 == 0xf) {
    fVar30 = fVar25 * fVar28 - fVar29 * fVar23;
    fVar33 = IVar22.y * fVar24 - fVar26 * IVar22.x;
    fVar27 = fVar26 - IVar22.y;
    auVar34._4_4_ = fVar27;
    auVar34._0_4_ = fVar27;
    auVar34._8_4_ = fVar27;
    auVar34._12_4_ = fVar27;
    auVar35._4_12_ = auVar34._4_12_;
    auVar35._0_4_ = fVar27 * (fVar28 - fVar23) - (fVar29 - fVar25) * (fVar24 - IVar22.x);
    auVar31._0_4_ = fVar30 * (fVar24 - IVar22.x) - fVar33 * (fVar28 - fVar23);
    auVar31._4_4_ = fVar30 * fVar27 - fVar33 * (fVar29 - fVar25);
    auVar31._8_4_ = fVar25 * 0.0 - IVar22.y * 0.0;
    auVar31._12_4_ = fVar25 * 0.0 - IVar22.y * 0.0;
    auVar37._0_8_ = auVar35._0_8_;
    auVar37._8_4_ = fVar27;
    auVar37._12_4_ = fVar27;
    auVar36._8_8_ = auVar37._8_8_;
    auVar36._4_4_ = auVar35._0_4_;
    auVar36._0_4_ = auVar35._0_4_;
    auVar32 = divps(auVar31,auVar36);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = this->Col;
    pIVar6[1].pos.x = fVar23;
    pIVar6[1].pos.y = fVar25;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = this->Col;
    pIVar6[2].pos = auVar32._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = this->Col;
    pIVar6[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = this->Col;
    pIVar6[4].pos = IVar22;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar6 + 5;
    uVar16 = DrawList->_VtxCurrentIdx;
    pIVar7 = DrawList->_IdxWritePtr;
    IVar15 = (ImDrawIdx)uVar16;
    *pIVar7 = IVar15;
    uVar14 = (byte)((byte)uVar19 & IVar22.y < fVar25 | -(fVar26 < fVar29) & -(fVar25 < IVar22.y)) &
             1;
    pIVar7[1] = IVar15 + uVar14 + 1;
    pIVar7[2] = IVar15 + 3;
    pIVar7[3] = IVar15 + 1;
    pIVar7[4] = (uVar14 ^ 3) + IVar15;
    pIVar7[5] = IVar15 + 4;
    DrawList->_IdxWritePtr = pIVar7 + 6;
    DrawList->_VtxCurrentIdx = uVar16 + 5;
  }
  (this->P11).x = fVar23;
  (this->P11).y = fVar25;
  (this->P12).x = IVar22.x;
  (this->P12).y = IVar22.y;
  return (char)iVar12 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }